

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::FillerParameter::FillerParameter(FillerParameter *this,FillerParameter *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  FillerParameter *from_local;
  FillerParameter *this_local;
  Container *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FillerParameter_00d4db10;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  pbVar2 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)_default_type__abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->type_,pbVar2);
  bVar1 = has_type(from);
  if (bVar1) {
    pbVar2 = google::protobuf::internal::
             ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)_default_type__abi_cxx11_);
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->type_,pbVar2,(from->type_).ptr_);
  }
  memcpy(&this->value_,&from->value_,0x1c);
  return;
}

Assistant:

FillerParameter::FillerParameter(const FillerParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  type_.UnsafeSetDefault(&FillerParameter::_default_type_.get());
  if (from.has_type()) {
    type_.AssignWithDefault(&FillerParameter::_default_type_.get(), from.type_);
  }
  ::memcpy(&value_, &from.value_,
    reinterpret_cast<char*>(&std_) -
    reinterpret_cast<char*>(&value_) + sizeof(std_));
  // @@protoc_insertion_point(copy_constructor:caffe.FillerParameter)
}